

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void init_opt_stats_opts(char *v,size_t vlen,char *dest)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  
  if (vlen != 0) {
    sVar2 = strlen(dest);
    sVar4 = 0;
    do {
      bVar1 = v[sVar4];
      if (((bVar1 - 0x4a < 0x2f) && ((0x400c6d800001U >> ((ulong)(bVar1 - 0x4a) & 0x3f) & 1) != 0))
         && (pcVar3 = strchr(dest,(uint)bVar1), pcVar3 == (char *)0x0)) {
        dest[sVar2] = bVar1;
        dest[sVar2 + 1] = '\0';
        sVar2 = sVar2 + 1;
      }
      sVar4 = sVar4 + 1;
    } while (vlen != sVar4);
  }
  return;
}

Assistant:

static void
init_opt_stats_opts(const char *v, size_t vlen, char *dest) {
	size_t opts_len = strlen(dest);
	assert(opts_len <= stats_print_tot_num_options);

	for (size_t i = 0; i < vlen; i++) {
		switch (v[i]) {
#define OPTION(o, v, d, s) case o: break;
			STATS_PRINT_OPTIONS
#undef OPTION
		default: continue;
		}

		if (strchr(dest, v[i]) != NULL) {
			/* Ignore repeated. */
			continue;
		}

		dest[opts_len++] = v[i];
		dest[opts_len] = '\0';
		assert(opts_len <= stats_print_tot_num_options);
	}
	assert(opts_len == strlen(dest));
}